

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataManager::ClearModifiedBlocks
          (MetadataManager *this,vector<duckdb::MetaBlockPointer,_true> *pointers)

{
  pointer pMVar1;
  ulong uVar2;
  byte bVar3;
  iterator iVar4;
  InternalException *this_00;
  pointer pMVar5;
  allocator local_59;
  block_id_t block_id;
  string local_50;
  
  pMVar5 = (pointers->
           super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
           super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (pointers->
           super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
           super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pMVar5 == pMVar1) {
      return;
    }
    uVar2 = pMVar5->block_pointer;
    block_id = uVar2 & 0xffffffffffffff;
    iVar4 = ::std::
            _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->modified_blocks)._M_h,&block_id);
    if (iVar4.super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0) break;
    bVar3 = (byte)(uVar2 >> 0x38) & 0x3f;
    *(ulong *)((long)iVar4.super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>.
                     _M_cur + 0x10) =
         *(ulong *)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>.
                          _M_cur + 0x10) & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    pMVar5 = pMVar5 + 1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"ClearModifiedBlocks - Block id %llu not found in modified_blocks",
             &local_59);
  InternalException::InternalException<long>(this_00,&local_50,block_id);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MetadataManager::ClearModifiedBlocks(const vector<MetaBlockPointer> &pointers) {
	for (auto &pointer : pointers) {
		auto block_id = pointer.GetBlockId();
		auto block_index = pointer.GetBlockIndex();
		auto entry = modified_blocks.find(block_id);
		if (entry == modified_blocks.end()) {
			throw InternalException("ClearModifiedBlocks - Block id %llu not found in modified_blocks", block_id);
		}
		auto &modified_list = entry->second;
		// verify the block has been modified
		D_ASSERT(modified_list && (1ULL << block_index));
		// unset the bit
		modified_list &= ~(1ULL << block_index);
	}
}